

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_memory_error.h
# Opt level: O1

double __thiscall nodecpp::error::memory_error_domain::log(memory_error_domain *this,double __x)

{
  bool bVar1;
  char *pcVar2;
  LogLevel in_EDX;
  long in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  char local_38 [8];
  char *local_30;
  ModuleID local_28;
  
  bVar1 = impl::isDataStackInfo((StackInfo *)(in_RSI + 8));
  if (bVar1) {
    (*(this->super_error_domain)._vptr_error_domain[1])(local_38,this);
    pcVar2 = "";
    if (local_30 != (char *)0x0) {
      pcVar2 = local_30;
    }
    local_28.str = (char *)0x0;
    nodecpp::log::default_log::log<char_const*,char_const*>
              (&local_28,in_EDX,"{} happened at",pcVar2);
    dVar3 = extraout_XMM0_Qa;
    if ((local_38[0] == '\0') && (local_30 != (char *)0x0)) {
      free(local_30);
      local_30 = (char *)0x0;
      dVar3 = extraout_XMM0_Qa_00;
    }
    dVar3 = StackInfo::log((StackInfo *)(in_RSI + 8),dVar3);
  }
  else {
    (*(this->super_error_domain)._vptr_error_domain[1])(local_38,this);
    pcVar2 = "";
    if (local_30 != (char *)0x0) {
      pcVar2 = local_30;
    }
    local_28.str = (char *)0x0;
    nodecpp::log::default_log::log<char_const*,char_const*>(&local_28,in_EDX,"{}",pcVar2);
    dVar3 = extraout_XMM0_Qa_01;
    if ((local_38[0] == '\0') && (local_30 != (char *)0x0)) {
      free(local_30);
      dVar3 = extraout_XMM0_Qa_02;
    }
  }
  return dVar3;
}

Assistant:

virtual void log(error_value* value, log::LogLevel l ) const { 
			if ( ::nodecpp::impl::isDataStackInfo( value->stackInfo ) )
			{
				log::default_log::log( l, "{} happened at", value_to_message( value ).c_str() );
				value->stackInfo.log( l );
			}
			else
				log::default_log::log( l, "{}", value_to_message( value ).c_str() );
		}